

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O3

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_256f7::read_dic(anon_unknown_dwarf_256f7 *this,string *dic_name)

{
  int iVar1;
  ostream *poVar2;
  DictionarySGL<false,_false> *this_00;
  __uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true> extraout_RAX;
  __uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> _Var3;
  string dic_type;
  ifstream ifs;
  undefined8 local_248;
  _Head_base<0UL,_ddd::Dictionary_*,_false> local_240;
  long local_238;
  undefined1 local_230 [16];
  long local_220 [4];
  byte abStack_200 [488];
  
  std::__cxx11::string::find_last_of((char *)dic_name,0x12a499,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_240,(ulong)dic_name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"read dic from ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(dic_name->_M_dataplus)._M_p,dic_name->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ifstream::ifstream(local_220,(string *)dic_name,_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_240);
    if (iVar1 == 0) {
      this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
      ddd::DictionarySGL<false,_false>::DictionarySGL(this_00,(istream *)local_220);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_240);
      if (iVar1 == 0) {
        this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
        ddd::DictionarySGL<false,_true>::DictionarySGL
                  ((DictionarySGL<false,_true> *)this_00,(istream *)local_220);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_240);
        if (iVar1 == 0) {
          this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_false>::DictionarySGL
                    ((DictionarySGL<true,_false> *)this_00,(istream *)local_220);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_240);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)&local_240);
            if (iVar1 == 0) {
              ddd::make_unique<ddd::DictionaryMLT<false,false>,std::ifstream&>
                        ((ddd *)&local_248,
                         (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&local_240);
              if (iVar1 == 0) {
                ddd::make_unique<ddd::DictionaryMLT<false,true>,std::ifstream&>
                          ((ddd *)&local_248,
                           (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&local_240);
                if (iVar1 == 0) {
                  ddd::make_unique<ddd::DictionaryMLT<true,false>,std::ifstream&>
                            ((ddd *)&local_248,
                             (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar1 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"invalid extension ",0x12);
                    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cerr,(char *)local_240._M_head_impl,
                                        local_238);
                    std::endl<char,std::char_traits<char>>(poVar2);
                    goto LAB_001145b3;
                  }
                  ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                            ((ddd *)&local_248,
                             (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
                }
              }
            }
            *(undefined8 *)this = local_248;
            goto LAB_00114733;
          }
          this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_true>::DictionarySGL
                    ((DictionarySGL<true,_true> *)this_00,(istream *)local_220);
        }
      }
    }
    *(DictionarySGL<false,_false> **)this = this_00;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"failed to open ",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dic_name->_M_dataplus)._M_p,
                        dic_name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
LAB_001145b3:
    *(undefined8 *)this = 0;
  }
LAB_00114733:
  std::ifstream::~ifstream(local_220);
  _Var3._M_t.super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
  super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl =
       (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)local_230;
  if ((tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)local_240._M_head_impl !=
      (_Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
      _Var3._M_t.super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
      super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl) {
    operator_delete(local_240._M_head_impl);
    _Var3._M_t.super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
    super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl =
         (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
         (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
         extraout_RAX.super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>.
         _M_t.super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
         super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
  }
  return (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>)
         _Var3._M_t.super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>
         .super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Dictionary> read_dic(const std::string dic_name) {
  std::string dic_type{dic_name.substr(dic_name.find_last_of(".") + 1)};

  std::cout << "read dic from " << dic_name << std::endl;
  std::ifstream ifs{dic_name};
  if (!ifs) {
    std::cerr << "failed to open " << dic_name << std::endl;
    return nullptr;
  }

  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>(ifs);
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>(ifs);
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>(ifs);
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>(ifs);
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>(ifs);
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>(ifs);
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>(ifs);
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>(ifs);
  }

  std::cerr << "invalid extension " << dic_type << std::endl;
  return nullptr;
}